

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_mpsc_llfifo_unittest.cpp
# Opt level: O2

void __thiscall
cesl_mpsc_llfifo_unittest_pop_single_element_Test::cesl_mpsc_llfifo_unittest_pop_single_element_Test
          (cesl_mpsc_llfifo_unittest_pop_single_element_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00144af0;
  return;
}

Assistant:

TEST(cesl_mpsc_llfifo_unittest, pop_single_element)
{
    cesl_mpsc_llfifo_create(&my_fifo_g, my_fifo_elem_max_size, my_fifo_elems_max_count, (char*)my_fifo_buffer_g);
    test_cesl_mpsc_llfifo_push("first");
    EXPECT_EQ(1, cesl_mpsc_llfifo_size(&my_fifo_g));
    EXPECT_EQ(0, cesl_mpsc_llfifo_full(&my_fifo_g));
    EXPECT_EQ(0, cesl_mpsc_llfifo_empty(&my_fifo_g));
    EXPECT_EQ(std::string("first"), cesl_mpsc_llfifo_front(&my_fifo_g));
    auto ok = cesl_mpsc_llfifo_pop(&my_fifo_g);
    EXPECT_EQ(1, ok);
    EXPECT_EQ(0, cesl_mpsc_llfifo_size(&my_fifo_g));
    EXPECT_EQ(0, cesl_mpsc_llfifo_full(&my_fifo_g));
    EXPECT_EQ(1, cesl_mpsc_llfifo_empty(&my_fifo_g));
}